

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDisplayNode.h
# Opt level: O2

void __thiscall
MinVR::VRDisplayNode::_addValueNeeded(VRDisplayNode *this,string *name,bool required)

{
  value_type local_40;
  
  std::__cxx11::string::string((string *)&local_40,(string *)name);
  local_40.second = required;
  std::__cxx11::
  list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::push_back(&this->_valuesNeeded,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void _addValueNeeded(const std::string name, const bool required = true) {
    _valuesNeeded.push_back(std::pair<std::string, bool>(name, required));
  }